

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

StringRef * __thiscall Catch::StringRef::operator=(StringRef *this,StringRef *other)

{
  StringRef *other_local;
  StringRef *this_local;
  
  if (other != this) {
    deleteIfOwned(this);
    this->m_data = other->m_data;
    this->m_size = other->m_size;
    if (other->m_ownership == FullStringOwned) {
      this->m_ownership = FullStringRef;
    }
    else {
      this->m_ownership = other->m_ownership;
    }
  }
  return this;
}

Assistant:

auto StringRef::operator = ( StringRef const& other ) -> StringRef& {
        if( &other == this )
            return *this;
        deleteIfOwned();
        m_data = other.m_data;
        m_size = other.m_size;
        if( other.m_ownership == Ownership::FullStringOwned )
            m_ownership = Ownership::FullStringRef;
            else
                m_ownership = other.m_ownership;
                return *this;
    }